

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  int iVar1;
  ImGuiPlatformMonitor *pIVar2;
  ImGuiPlatformIO *pIVar3;
  GLFWmonitor **ppGVar4;
  ImGuiPlatformMonitor *pIVar5;
  GLFWvidmode *pGVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  int y;
  int x;
  int monitors_count;
  float x_scale;
  int h;
  int w;
  float y_scale;
  int local_70;
  int local_6c;
  int local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  int local_3c;
  int local_38;
  float local_34;
  
  pIVar3 = ImGui::GetPlatformIO();
  local_68 = 0;
  ppGVar4 = glfwGetMonitors(&local_68);
  iVar11 = (pIVar3->Monitors).Capacity;
  if (iVar11 < 0) {
    uVar7 = iVar11 / 2 + iVar11;
    uVar10 = 0;
    if (0 < (int)uVar7) {
      uVar10 = (ulong)uVar7;
    }
    pIVar5 = (ImGuiPlatformMonitor *)ImGui::MemAlloc(uVar10 * 0x24);
    pIVar2 = (pIVar3->Monitors).Data;
    if (pIVar2 != (ImGuiPlatformMonitor *)0x0) {
      memcpy(pIVar5,pIVar2,(long)(pIVar3->Monitors).Size * 0x24);
      ImGui::MemFree((pIVar3->Monitors).Data);
    }
    (pIVar3->Monitors).Data = pIVar5;
    (pIVar3->Monitors).Capacity = (int)uVar10;
  }
  (pIVar3->Monitors).Size = 0;
  if (0 < local_68) {
    lVar9 = 0;
    do {
      glfwGetMonitorPos(ppGVar4[lVar9],&local_6c,&local_70);
      pGVar6 = glfwGetVideoMode(ppGVar4[lVar9]);
      local_44 = (float)local_6c;
      local_48 = (float)local_70;
      local_4c = (float)pGVar6->width;
      local_50 = (float)pGVar6->height;
      glfwGetMonitorWorkarea(ppGVar4[lVar9],&local_6c,&local_70,&local_38,&local_3c);
      local_54 = (float)local_6c;
      local_58 = (float)local_70;
      local_5c = (float)local_38;
      local_60 = (float)local_3c;
      glfwGetMonitorContentScale(ppGVar4[lVar9],&local_40,&local_34);
      iVar11 = (pIVar3->Monitors).Size;
      iVar1 = (pIVar3->Monitors).Capacity;
      fVar12 = local_40;
      if (iVar11 == iVar1) {
        if (iVar1 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar1 / 2 + iVar1;
        }
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar8) {
          iVar11 = iVar8;
        }
        if (iVar1 < iVar11) {
          local_64 = local_40;
          pIVar5 = (ImGuiPlatformMonitor *)ImGui::MemAlloc((long)iVar11 * 0x24);
          pIVar2 = (pIVar3->Monitors).Data;
          if (pIVar2 != (ImGuiPlatformMonitor *)0x0) {
            memcpy(pIVar5,pIVar2,(long)(pIVar3->Monitors).Size * 0x24);
            ImGui::MemFree((pIVar3->Monitors).Data);
          }
          (pIVar3->Monitors).Data = pIVar5;
          (pIVar3->Monitors).Capacity = iVar11;
          fVar12 = local_64;
        }
      }
      pIVar2 = (pIVar3->Monitors).Data;
      iVar11 = (pIVar3->Monitors).Size;
      pIVar2[iVar11].MainPos.x = local_44;
      pIVar2[iVar11].MainPos.y = local_48;
      pIVar2[iVar11].MainSize.x = local_4c;
      pIVar2[iVar11].MainSize.y = local_50;
      pIVar2[iVar11].WorkPos.x = local_54;
      pIVar2[iVar11].WorkPos.y = local_58;
      pIVar2[iVar11].WorkSize.x = local_5c;
      pIVar2[iVar11].WorkSize.y = local_60;
      pIVar2[iVar11].DpiScale = fVar12;
      (pIVar3->Monitors).Size = (pIVar3->Monitors).Size + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < local_68);
  }
  g_WantUpdateMonitors = 1;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}